

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O3

bool __thiscall
libcellml::ComponentEntity::containsComponent
          (ComponentEntity *this,string *name,bool searchEncapsulated)

{
  EntityImpl *pEVar1;
  const_iterator cVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ComponentEntity local_38;
  
  cVar2 = ComponentEntityImpl::findComponent
                    ((ComponentEntityImpl *)
                     (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,name);
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  bVar5 = cVar2._M_current !=
          *(shared_ptr<libcellml::Component> **)((long)&pEVar1[2].mId.field_2 + 8);
  if (searchEncapsulated && !bVar5) {
    if (cVar2._M_current ==
        (shared_ptr<libcellml::Component> *)pEVar1[2].mId.field_2._M_allocated_capacity) {
      bVar5 = false;
    }
    else {
      uVar3 = 1;
      do {
        component(&local_38,(size_t)this);
        bVar5 = containsComponent((ComponentEntity *)
                                  local_38.super_NamedEntity.super_ParentedEntity.super_Entity.
                                  _vptr_Entity,name,true);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
        }
        pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        bVar4 = uVar3 < (ulong)((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                                      pEVar1[2].mId.field_2._M_allocated_capacity) >> 4);
        uVar3 = uVar3 + 1;
      } while (bVar4 && !bVar5);
    }
  }
  return bVar5;
}

Assistant:

bool ComponentEntity::containsComponent(const std::string &name, bool searchEncapsulated) const
{
    bool status = false;
    auto result = pFunc()->findComponent(name);
    if (result != pFunc()->mComponents.end()) {
        status = true;
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = component(i)->containsComponent(name, searchEncapsulated);
        }
    }

    return status;
}